

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::flags_internal::FlagRegistry::RegisterFlag
          (FlagRegistry *this,CommandLineFlag *flag,char *filename)

{
  CommandLineFlag *pCVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  pointer prVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  char **args;
  char (*in_stack_fffffffffffffde8) [179];
  string local_210;
  FlagRegistry *local_1f0;
  size_t local_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  basic_string_view<char,_std::char_traits<char>_> local_1c0 [2];
  undefined1 local_1a0 [48];
  undefined1 local_170 [16];
  CommandLineFlag *local_160 [2];
  AlphaNum local_150;
  char *filename_local;
  AlphaNum local_118;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  char *local_c0;
  MaybeInitializedPtr local_b8;
  FlagRegistry *local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_68 [16];
  long local_58;
  code *local_50;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>::iterator,_bool>
  ins;
  
  filename_local = filename;
  if (filename != (char *)0x0) {
    (**(code **)(*(long *)flag + 8))(local_1d0,flag);
    absl::lts_20240722::flags_internal::GetUsageConfig();
    local_150.piece_._M_len = strlen(filename);
    local_150.piece_._M_str = filename;
    if (local_58 == 0) {
      std::__throw_bad_function_call();
    }
    else {
      (*local_50)(local_1a0,local_68,&local_150);
      if (local_1d0._8_8_ == local_1a0._8_8_) {
        if ((void *)local_1d0._8_8_ == (void *)0x0) {
          bVar9 = false;
        }
        else {
          iVar5 = bcmp((void *)local_1d0._0_8_,(void *)local_1a0._0_8_,local_1d0._8_8_);
          bVar9 = iVar5 != 0;
        }
      }
      else {
        bVar9 = true;
      }
      if (local_1a0._0_8_ != (long)local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      FlagsUsageConfig::~FlagsUsageConfig((FlagsUsageConfig *)local_e8);
      if ((basic_string_view<char,_std::char_traits<char>_> *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_len + 1);
      }
      if (!bVar9) goto LAB_00106cae;
    }
    local_e8._0_8_ = 0x3d;
    local_e8._8_8_ = "Inconsistency between flag object and registration for flag \'";
    local_1d0 = (*(code *)**(undefined8 **)flag)(flag);
    local_1a0._0_8_ = (FlagRegistry *)0x46;
    local_1a0._8_8_ = "\', likely due to duplicate flags or an ODR violation. Relevant files: ";
    args = (char **)0x106de7;
    (**(code **)(*(long *)flag + 8))(&local_1f0,flag);
    local_150.piece_._M_len = local_1e8;
    local_150.piece_._M_str = (char *)local_1f0;
    local_118.piece_._M_len = 5;
    local_118.piece_._M_str = " and ";
    StrCat<char_const*>(&local_210,(lts_20240722 *)local_e8,(AlphaNum *)local_1d0,
                        (AlphaNum *)local_1a0,&local_150,&local_118,(AlphaNum *)&filename_local,args
                       );
    absl::lts_20240722::flags_internal::ReportUsageError
              (local_210._M_string_length,local_210._M_dataplus._M_p,1);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    goto LAB_00106e64;
  }
LAB_00106cae:
  absl::lts_20240722::Mutex::Lock();
  local_e8 = (*(code *)**(undefined8 **)flag)(flag);
  local_1d0._0_8_ = local_e8;
  local_1d0._8_8_ = local_d8;
  local_1a0._0_8_ = this;
  local_d8._0_8_ = flag;
  container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::CommandLineFlag*>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::lts_20240722::CommandLineFlag*>>>
  ::EmplaceDecomposable::operator()
            (&ins,local_1a0,(basic_string_view<char,_std::char_traits<char>_> *)local_1d0._0_8_,
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_1d0,
             (tuple<absl::lts_20240722::CommandLineFlag_*&&> *)(local_1d0 + 8));
  if (ins.second != false) {
LAB_00106d70:
    absl::lts_20240722::Mutex::Unlock();
    return;
  }
  prVar6 = container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
           ::iterator::operator->(&ins.first);
  pCVar1 = prVar6->second;
  cVar3 = (**(code **)(*(long *)flag + 0x18))(flag);
  cVar4 = (**(code **)(*(long *)pCVar1 + 0x18))(pCVar1);
  if (cVar3 == cVar4) {
    lVar7 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId(flag);
    lVar8 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId(pCVar1);
    if (lVar7 == lVar8) {
      cVar3 = (**(code **)(*(long *)pCVar1 + 0x18))(pCVar1);
      if (cVar3 != '\0') goto LAB_00106d70;
      (**(code **)(*(long *)pCVar1 + 8))(local_e8,pCVar1);
      (**(code **)(*(long *)flag + 8))(local_1d0,flag);
      uVar2 = local_1d0._0_8_;
      if (local_e8._8_8_ == local_1d0._8_8_) {
        if ((char *)local_e8._8_8_ == (char *)0x0) {
          bVar9 = false;
        }
        else {
          iVar5 = bcmp((void *)local_e8._0_8_,(void *)local_1d0._0_8_,local_e8._8_8_);
          bVar9 = iVar5 != 0;
        }
      }
      else {
        bVar9 = true;
      }
      if ((basic_string_view<char,_std::char_traits<char>_> *)uVar2 != local_1c0) {
        operator_delete((void *)uVar2,local_1c0[0]._M_len + 1);
      }
      if ((undefined1 *)local_e8._0_8_ != local_d8) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
      }
      if (bVar9) {
        local_e8._0_8_ = 6;
        local_e8._8_8_ = "Flag \'";
        local_1d0 = (*(code *)**(undefined8 **)flag)(flag);
        local_1a0._0_8_ = (FlagRegistry *)0x28;
        local_1a0._8_8_ = "\' was defined more than once (in files \'";
        (**(code **)(*(long *)pCVar1 + 8))(&local_1f0,pCVar1);
        local_150.piece_._M_len = local_1e8;
        local_150.piece_._M_str = (char *)local_1f0;
        local_118.piece_._M_len = 7;
        local_118.piece_._M_str = "\' and \'";
        (**(code **)(*(long *)flag + 8))((AlphaNum *)local_170,flag);
        StrCat<std::__cxx11::string,char[4]>
                  (&local_210,(lts_20240722 *)local_e8,(AlphaNum *)local_1d0,(AlphaNum *)local_1a0,
                   &local_150,&local_118,(AlphaNum *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\').",
                   (char (*) [4])in_stack_fffffffffffffde8);
        absl::lts_20240722::flags_internal::ReportUsageError
                  (local_210._M_string_length,local_210._M_dataplus._M_p,1);
      }
      else {
        local_e8._0_8_ = 0x1e;
        local_e8._8_8_ = "Something is wrong with flag \'";
        local_1d0 = (*(code *)**(undefined8 **)flag)(flag);
        local_1a0._0_8_ = (FlagRegistry *)0xb;
        local_1a0._8_8_ = "\' in file \'";
        (**(code **)(*(long *)flag + 8))(&local_1f0,flag);
        local_150.piece_._M_len = local_1e8;
        local_150.piece_._M_str = (char *)local_1f0;
        local_118.piece_._M_len = 0x1a;
        local_118.piece_._M_str = "\'. One possibility: file \'";
        (**(code **)(*(long *)flag + 8))((AlphaNum *)local_170,flag);
        StrCat<std::__cxx11::string,char[179]>
                  (&local_210,(lts_20240722 *)local_e8,(AlphaNum *)local_1d0,(AlphaNum *)local_1a0,
                   &local_150,&local_118,(AlphaNum *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is being linked both statically and dynamically into this executable. e.g. some files listed as srcs to a test and also listed as srcs of some shared lib deps of the same test."
                   ,in_stack_fffffffffffffde8);
        absl::lts_20240722::flags_internal::ReportUsageError
                  (local_210._M_string_length,local_210._M_dataplus._M_p,1);
      }
    }
    else {
      local_e8._0_8_ = 6;
      local_e8._8_8_ = "Flag \'";
      local_1d0 = (*(code *)**(undefined8 **)flag)(flag);
      local_1a0._0_8_ = (FlagRegistry *)0x49;
      local_1a0._8_8_ =
           "\' was defined more than once but with differing types. Defined in files \'";
      (**(code **)(*(long *)pCVar1 + 8))(&local_1f0,pCVar1);
      local_150.piece_._M_len = local_1e8;
      local_150.piece_._M_str = (char *)local_1f0;
      local_118.piece_._M_len = 7;
      local_118.piece_._M_str = "\' and \'";
      (**(code **)(*(long *)flag + 8))((AlphaNum *)local_170,flag);
      StrCat<std::__cxx11::string,char[3]>
                (&local_210,(lts_20240722 *)local_e8,(AlphaNum *)local_1d0,(AlphaNum *)local_1a0,
                 &local_150,&local_118,(AlphaNum *)local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\'.",
                 (char (*) [3])in_stack_fffffffffffffde8);
      absl::lts_20240722::flags_internal::ReportUsageError
                (local_210._M_string_length,local_210._M_dataplus._M_p,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((CommandLineFlag **)local_170._0_8_ != local_160) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_160[0] + 1));
    }
    local_1a0._16_8_ = local_1e0._0_8_;
    if (local_1f0 == (FlagRegistry *)local_1e0) goto LAB_00106e64;
  }
  else {
    auVar10 = (*(code *)**(undefined8 **)flag)(flag);
    cVar3 = (**(code **)(*(long *)flag + 0x18))(flag);
    if (cVar3 != '\0') {
      flag = pCVar1;
    }
    (**(code **)(*(long *)flag + 8))(local_1a0,flag);
    local_e8._0_8_ = 0xe;
    local_e8._8_8_ = "Retired flag \'";
    local_c8._0_1_ = (FlagKindFilter)0x20;
    local_c8._1_7_ = 0;
    local_c0 = "\' was defined normally in file \'";
    local_b8 = (MaybeInitializedPtr)local_1a0._8_8_;
    local_b0 = (FlagRegistry *)local_1a0._0_8_;
    local_a8._0_1_ = (FlagKindFilter)0x2;
    local_a8._1_7_ = 0;
    local_a0 = "\'.";
    local_d8 = auVar10;
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_1d0,local_e8,5);
    absl::lts_20240722::flags_internal::ReportUsageError(local_1d0._8_8_,local_1d0._0_8_,1);
    if ((basic_string_view<char,_std::char_traits<char>_> *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_len + 1);
    }
    local_1f0 = (FlagRegistry *)local_1a0._0_8_;
    if ((FlagRegistry *)local_1a0._0_8_ == (FlagRegistry *)(local_1a0 + 0x10)) goto LAB_00106e64;
  }
  operator_delete(local_1f0,local_1a0._16_8_ + 1);
LAB_00106e64:
  exit(1);
}

Assistant:

void FlagRegistry::RegisterFlag(CommandLineFlag& flag, const char* filename) {
  if (filename != nullptr &&
      flag.Filename() != GetUsageConfig().normalize_filename(filename)) {
    flags_internal::ReportUsageError(
        absl::StrCat(
            "Inconsistency between flag object and registration for flag '",
            flag.Name(),
            "', likely due to duplicate flags or an ODR violation. Relevant "
            "files: ",
            flag.Filename(), " and ", filename),
        true);
    std::exit(1);
  }

  FlagRegistryLock registry_lock(*this);

  std::pair<FlagIterator, bool> ins =
      flags_.insert(FlagMap::value_type(flag.Name(), &flag));
  if (ins.second == false) {  // means the name was already in the map
    CommandLineFlag& old_flag = *ins.first->second;
    if (flag.IsRetired() != old_flag.IsRetired()) {
      // All registrations must agree on the 'retired' flag.
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Retired flag '", flag.Name(), "' was defined normally in file '",
              (flag.IsRetired() ? old_flag.Filename() : flag.Filename()), "'."),
          true);
    } else if (flags_internal::PrivateHandleAccessor::TypeId(flag) !=
               flags_internal::PrivateHandleAccessor::TypeId(old_flag)) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once but with "
                       "differing types. Defined in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "'."),
          true);
    } else if (old_flag.IsRetired()) {
      return;
    } else if (old_flag.Filename() != flag.Filename()) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once (in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "')."),
          true);
    } else {
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Something is wrong with flag '", flag.Name(), "' in file '",
              flag.Filename(), "'. One possibility: file '", flag.Filename(),
              "' is being linked both statically and dynamically into this "
              "executable. e.g. some files listed as srcs to a test and also "
              "listed as srcs of some shared lib deps of the same test."),
          true);
    }
    // All cases above are fatal, except for the retired flags.
    std::exit(1);
  }
}